

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InlinePass::GenInlineCode
          (InlinePass *this,
          vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
          *new_blocks,
          vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
          *new_vars,iterator *call_inst_itr,
          UptrVectorIterator<spvtools::opt::BasicBlock,_false> call_block_itr)

{
  Function *pFVar1;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> call_block_itr_00;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t resultId;
  uint32_t uVar5;
  Instruction *pIVar6;
  IRContext *pIVar7;
  pointer pvVar8;
  mapped_type *ppFVar9;
  mapped_type *pmVar10;
  pointer pBVar11;
  reference this_00;
  TypeManager *this_01;
  undefined4 extraout_var;
  Instruction *this_02;
  DebugScope *dbg_scope;
  size_type sVar12;
  reference this_03;
  type pBVar13;
  mapped_type *ppBVar14;
  uint32_t local_2dc;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *local_2d8;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *blk;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *__range2;
  uint32_t new_id;
  Instruction *merge_inst;
  value_type *header;
  iterator local_290;
  iterator local_280;
  uint32_t local_274;
  undefined1 local_270 [4];
  uint32_t resId;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  iterator local_248;
  anon_class_32_4_16e56b1e local_238;
  function<void_(spvtools::opt::Instruction_*)> local_218;
  anon_class_16_2_d8a47d36 local_1f8;
  function<bool_(spvtools::opt::Instruction_*)> local_1e8;
  Type *local_1c8;
  Type *calleeType;
  uint32_t returnVarId;
  uint32_t calleeTypeId;
  undefined1 local_1b0 [48];
  undefined1 local_180 [8];
  _Hash_node_base local_178;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> new_blk_ptr
  ;
  uint32_t local_160 [2];
  uint32_t entry_blk_label_id;
  uint32_t local_14c;
  Function *local_148;
  Function *calleeFn;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
  single_trip_loop_cont_blk;
  undefined1 local_130 [7];
  bool caller_is_loop_header;
  DebugInlinedAtContext inlined_at_ctx;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  postCallSB;
  unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  preCallSB;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  callee2caller;
  iterator *call_inst_itr_local;
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  *new_vars_local;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *new_blocks_local;
  InlinePass *this_local;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> call_block_itr_local;
  
  call_block_itr_local.container_ = (UptrVector *)call_block_itr.iterator_._M_current;
  this_local = (InlinePass *)call_block_itr.container_;
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)&preCallSB._M_h._M_single_bucket);
  std::
  unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  ::unordered_map((unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                   *)&postCallSB._M_h._M_single_bucket);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)&inlined_at_ctx.callee_inlined_at2chain_._M_h._M_single_bucket);
  pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
           iterator_template<spvtools::opt::Instruction>::operator*(&call_inst_itr->super_iterator);
  analysis::DebugInlinedAtContext::DebugInlinedAtContext((DebugInlinedAtContext *)local_130,pIVar6);
  pIVar7 = Pass::context(&this->super_Pass);
  IRContext::InvalidateAnalyses(pIVar7,kAnalysisBegin);
  pvVar8 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                     ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&this_local);
  pIVar6 = BasicBlock::GetLoopMergeInst(pvVar8);
  single_trip_loop_cont_blk._M_t.
  super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>.
  _M_t.
  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl._7_1_ =
       pIVar6 != (Instruction *)0x0;
  std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>::
  unique_ptr<std::default_delete<spvtools::opt::BasicBlock>,void>
            ((unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>> *
             )&calleeFn);
  pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
           iterator_template<spvtools::opt::Instruction>::operator->(&call_inst_itr->super_iterator)
  ;
  local_14c = Instruction::GetSingleWordOperand(pIVar6,2);
  ppFVar9 = std::
            unordered_map<unsigned_int,_spvtools::opt::Function_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Function_*>_>_>
            ::operator[](&this->id2function_,&local_14c);
  pFVar1 = *ppFVar9;
  local_148 = pFVar1;
  InstructionList::iterator::iterator((iterator *)&entry_blk_label_id,call_inst_itr);
  MapParams(this,pFVar1,(iterator *)&entry_blk_label_id,
            (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             *)&preCallSB._M_h._M_single_bucket);
  bVar2 = CloneAndMapLocals(this,local_148,new_vars,
                            (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                             *)&preCallSB._M_h._M_single_bucket,(DebugInlinedAtContext *)local_130);
  if (!bVar2) {
    call_block_itr_local.iterator_._M_current._7_1_ = 0;
    local_160[1] = 1;
    goto LAB_003a1bd5;
  }
  _new_blk_ptr = Function::begin(local_148);
  pvVar8 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                     ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&new_blk_ptr);
  pIVar6 = BasicBlock::GetLabelInst(pvVar8);
  local_160[0] = Instruction::result_id(pIVar6);
  pvVar8 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                     ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&this_local);
  uVar3 = BasicBlock::id(pvVar8);
  pmVar10 = std::
            unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
            ::operator[]((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          *)&preCallSB._M_h._M_single_bucket,local_160);
  *pmVar10 = uVar3;
  pvVar8 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                     ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&this_local);
  BasicBlock::id(pvVar8);
  NewLabel((InlinePass *)local_180,(uint32_t)this);
  MakeUnique<spvtools::opt::BasicBlock,std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
            ((spvtools *)&local_178,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)local_180);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               *)local_180);
  pBVar11 = std::
            unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
            get((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 *)&local_178);
  InstructionList::iterator::iterator((iterator *)(local_1b0 + 0x28),call_inst_itr);
  local_1b0._24_8_ = this_local;
  local_1b0._32_8_ = call_block_itr_local.container_;
  call_block_itr_00.iterator_._M_current =
       (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *)
       call_block_itr_local.container_;
  call_block_itr_00.container_ = (UptrVector *)this_local;
  MoveInstsBeforeEntryBlock
            (this,(unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                   *)&postCallSB._M_h._M_single_bucket,pBVar11,(iterator *)(local_1b0 + 0x28),
             call_block_itr_00);
  bVar2 = false;
  if ((single_trip_loop_cont_blk._M_t.
       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
       .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl._7_1_ & 1) != 0) {
    local_1b0._8_16_ = (undefined1  [16])Function::begin(local_148);
    this_00 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                        ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)(local_1b0 + 8));
    pIVar6 = BasicBlock::GetMergeInst(this_00);
    bVar2 = pIVar6 != (Instruction *)0x0;
  }
  if (bVar2) {
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                *)&returnVarId,
               (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                *)&local_178);
    AddGuardBlock((InlinePass *)local_1b0,
                  (vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                   *)this,(unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                           *)new_blocks,
                  (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                   *)&preCallSB._M_h._M_single_bucket,(uint32_t)&returnVarId);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    operator=((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               *)&local_178,
              (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               *)local_1b0);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 *)local_1b0);
    std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 *)&returnVarId);
    bVar2 = std::operator==((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                             *)&local_178,(nullptr_t)0x0);
    if (!bVar2) goto LAB_003a1522;
    call_block_itr_local.iterator_._M_current._7_1_ = 0;
  }
  else {
LAB_003a1522:
    calleeType._4_4_ = Function::type_id(local_148);
    calleeType._0_4_ = 0;
    pIVar7 = Pass::context(&this->super_Pass);
    this_01 = IRContext::get_type_mgr(pIVar7);
    local_1c8 = analysis::TypeManager::GetType(this_01,calleeType._4_4_);
    iVar4 = (*local_1c8->_vptr_Type[5])();
    if ((CONCAT44(extraout_var,iVar4) == 0) &&
       (calleeType._0_4_ = CreateReturnVar(this,local_148,new_vars), (uint32_t)calleeType == 0)) {
      call_block_itr_local.iterator_._M_current._7_1_ = 0;
    }
    else {
      pFVar1 = local_148;
      local_1f8.callee2caller =
           (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
            *)&preCallSB._M_h._M_single_bucket;
      local_1f8.this = this;
      std::function<bool(spvtools::opt::Instruction*)>::
      function<spvtools::opt::InlinePass::GenInlineCode(std::vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>*,std::vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>*,spvtools::opt::InstructionList::iterator,spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,false>)::__0,void>
                ((function<bool(spvtools::opt::Instruction*)> *)&local_1e8,&local_1f8);
      Function::WhileEachInst(pFVar1,&local_1e8,false,false);
      std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_1e8);
      pFVar1 = local_148;
      local_238.new_blk_ptr =
           (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *
           )&local_178;
      local_238.callee2caller =
           (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
            *)&preCallSB._M_h._M_single_bucket;
      local_238.inlined_at_ctx = (DebugInlinedAtContext *)local_130;
      local_238.this = this;
      std::function<void(spvtools::opt::Instruction*)>::
      function<spvtools::opt::InlinePass::GenInlineCode(std::vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>*,std::vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>*,spvtools::opt::InstructionList::iterator,spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,false>)::__1,void>
                ((function<void(spvtools::opt::Instruction*)> *)&local_218,&local_238);
      Function::ForEachDebugInstructionsInHeader(pFVar1,&local_218);
      std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_218);
      local_248 = Function::begin(local_148);
      bVar2 = InlineEntryBlock(this,(unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                     *)&preCallSB._M_h._M_single_bucket,
                               (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                                *)&local_178,local_248,(DebugInlinedAtContext *)local_130);
      if (bVar2) {
        std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ::unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                      *)local_258,
                     (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                      *)&local_178);
        InlineBasicBlocks((InlinePass *)(local_258 + 8),
                          (vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                           *)this,(unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                   *)new_blocks,
                          (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                           *)&preCallSB._M_h._M_single_bucket,(DebugInlinedAtContext *)local_258,
                          (Function *)local_130);
        std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ::operator=((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                     *)&local_178,
                    (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                     *)(local_258 + 8));
        std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ::~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                       *)(local_258 + 8));
        std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ::~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                       *)local_258);
        bVar2 = std::operator==((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                                 *)&local_178,(nullptr_t)0x0);
        if (bVar2) {
          call_block_itr_local.iterator_._M_current._7_1_ = 0;
        }
        else {
          std::
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
          unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                      *)local_268,
                     (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                      *)&local_178);
          pFVar1 = local_148;
          Function::tail(local_148);
          BasicBlock::tail((BasicBlock *)local_270);
          pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
                   iterator_template<spvtools::opt::Instruction>::operator*
                             ((iterator_template<spvtools::opt::Instruction> *)local_270);
          InlineReturn((InlinePass *)(local_268 + 8),
                       (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                        *)this,(vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                                *)&preCallSB._M_h._M_single_bucket,
                       (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                        *)new_blocks,(DebugInlinedAtContext *)local_268,(Function *)local_130,
                       (Instruction *)pFVar1,(uint32_t)pIVar6);
          std::
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
          operator=((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                     *)&local_178,
                    (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                     *)(local_268 + 8));
          std::
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
          ~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                       *)(local_268 + 8));
          std::
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
          ~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                       *)local_268);
          if ((uint32_t)calleeType != 0) {
            pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
                     iterator_template<spvtools::opt::Instruction>::operator->
                               (&call_inst_itr->super_iterator);
            resultId = Instruction::result_id(pIVar6);
            uVar5 = calleeType._4_4_;
            uVar3 = (uint32_t)calleeType;
            local_274 = resultId;
            if (resultId == 0) {
              __assert_fail("resId != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_pass.cpp"
                            ,0x2a4,
                            "bool spvtools::opt::InlinePass::GenInlineCode(std::vector<std::unique_ptr<BasicBlock>> *, std::vector<std::unique_ptr<Instruction>> *, BasicBlock::iterator, UptrVectorIterator<BasicBlock>)"
                           );
            }
            pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
                     iterator_template<spvtools::opt::Instruction>::operator->
                               (&call_inst_itr->super_iterator);
            pIVar6 = Instruction::dbg_line_inst(pIVar6);
            this_02 = utils::IntrusiveList<spvtools::opt::Instruction>::
                      iterator_template<spvtools::opt::Instruction>::operator->
                                (&call_inst_itr->super_iterator);
            dbg_scope = Instruction::GetDebugScope(this_02);
            AddLoad(this,uVar5,resultId,uVar3,
                    (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                     *)&local_178,pIVar6,dbg_scope);
          }
          InstructionList::iterator::iterator(&local_280,call_inst_itr);
          local_290 = Function::begin(local_148);
          _header = Function::end(local_148);
          bVar2 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                            (&local_290,
                             (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&header);
          bVar2 = MoveCallerInstsAfterFunctionCall
                            (this,(unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                                   *)&postCallSB._M_h._M_single_bucket,
                             (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                              *)&inlined_at_ctx.callee_inlined_at2chain_._M_h._M_single_bucket,
                             (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                              *)&local_178,&local_280,bVar2);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            std::
            vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ::push_back(new_blocks,(value_type *)&local_178);
            if (((single_trip_loop_cont_blk._M_t.
                  super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl._7_1_ & 1)
                 != 0) &&
               (sVar12 = std::
                         vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                         ::size(new_blocks), 1 < sVar12)) {
              MoveLoopMergeInstToFirstBlock(this,new_blocks);
              this_03 = std::
                        vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                        ::front(new_blocks);
              pBVar11 = std::
                        unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                        ::operator->(this_03);
              pIVar6 = BasicBlock::GetLoopMergeInst(pBVar11);
              uVar3 = Instruction::GetSingleWordInOperand(pIVar6,1);
              pBVar11 = std::
                        unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                        ::operator->(this_03);
              uVar5 = BasicBlock::id(pBVar11);
              if (uVar3 == uVar5) {
                pIVar7 = Pass::context(&this->super_Pass);
                uVar3 = IRContext::TakeNextId(pIVar7);
                if (uVar3 == 0) {
                  call_block_itr_local.iterator_._M_current._7_1_ = 0;
                  goto LAB_003a1bc9;
                }
                UpdateSingleBlockLoopContinueTarget(this,uVar3,new_blocks);
              }
            }
            __end2 = std::
                     vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                     ::begin(new_blocks);
            blk = (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                   *)std::
                     vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                     ::end(new_blocks);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end2,(__normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
                                               *)&blk), bVar2) {
              local_2d8 = __gnu_cxx::
                          __normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
                          ::operator*(&__end2);
              pBVar13 = std::
                        unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                        ::operator*(local_2d8);
              pBVar11 = std::
                        unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                        ::operator->(local_2d8);
              local_2dc = BasicBlock::id(pBVar11);
              ppBVar14 = std::
                         unordered_map<unsigned_int,_spvtools::opt::BasicBlock_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>_>
                         ::operator[](&this->id2block_,&local_2dc);
              *ppBVar14 = pBVar13;
              __gnu_cxx::
              __normal_iterator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_*,_std::vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>_>
              ::operator++(&__end2);
            }
            pIVar7 = Pass::context(&this->super_Pass);
            pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
                     iterator_template<spvtools::opt::Instruction>::operator*
                               (&call_inst_itr->super_iterator);
            IRContext::KillNamesAndDecorates(pIVar7,pIVar6);
            call_block_itr_local.iterator_._M_current._7_1_ = 1;
          }
          else {
            call_block_itr_local.iterator_._M_current._7_1_ = 0;
          }
        }
      }
      else {
        call_block_itr_local.iterator_._M_current._7_1_ = 0;
      }
    }
  }
LAB_003a1bc9:
  local_160[1] = 1;
  std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
  ~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               *)&local_178);
LAB_003a1bd5:
  std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
  ~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               *)&calleeFn);
  analysis::DebugInlinedAtContext::~DebugInlinedAtContext((DebugInlinedAtContext *)local_130);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    *)&inlined_at_ctx.callee_inlined_at2chain_._M_h._M_single_bucket);
  std::
  unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                    *)&postCallSB._M_h._M_single_bucket);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                    *)&preCallSB._M_h._M_single_bucket);
  return (bool)(call_block_itr_local.iterator_._M_current._7_1_ & 1);
}

Assistant:

bool InlinePass::GenInlineCode(
    std::vector<std::unique_ptr<BasicBlock>>* new_blocks,
    std::vector<std::unique_ptr<Instruction>>* new_vars,
    BasicBlock::iterator call_inst_itr,
    UptrVectorIterator<BasicBlock> call_block_itr) {
  // Map from all ids in the callee to their equivalent id in the caller
  // as callee instructions are copied into caller.
  std::unordered_map<uint32_t, uint32_t> callee2caller;
  // Pre-call same-block insts
  std::unordered_map<uint32_t, Instruction*> preCallSB;
  // Post-call same-block op ids
  std::unordered_map<uint32_t, uint32_t> postCallSB;

  analysis::DebugInlinedAtContext inlined_at_ctx(&*call_inst_itr);

  // Invalidate the def-use chains.  They are not kept up to date while
  // inlining.  However, certain calls try to keep them up-to-date if they are
  // valid.  These operations can fail.
  context()->InvalidateAnalyses(IRContext::kAnalysisDefUse);

  // If the caller is a loop header and the callee has multiple blocks, then the
  // normal inlining logic will place the OpLoopMerge in the last of several
  // blocks in the loop.  Instead, it should be placed at the end of the first
  // block.  We'll wait to move the OpLoopMerge until the end of the regular
  // inlining logic, and only if necessary.
  bool caller_is_loop_header = call_block_itr->GetLoopMergeInst() != nullptr;

  // Single-trip loop continue block
  std::unique_ptr<BasicBlock> single_trip_loop_cont_blk;

  Function* calleeFn = id2function_[call_inst_itr->GetSingleWordOperand(
      kSpvFunctionCallFunctionId)];

  // Map parameters to actual arguments.
  MapParams(calleeFn, call_inst_itr, &callee2caller);

  // Define caller local variables for all callee variables and create map to
  // them.
  if (!CloneAndMapLocals(calleeFn, new_vars, &callee2caller, &inlined_at_ctx)) {
    return false;
  }

  // First block needs to use label of original block
  // but map callee label in case of phi reference.
  uint32_t entry_blk_label_id = calleeFn->begin()->GetLabelInst()->result_id();
  callee2caller[entry_blk_label_id] = call_block_itr->id();
  std::unique_ptr<BasicBlock> new_blk_ptr =
      MakeUnique<BasicBlock>(NewLabel(call_block_itr->id()));

  // Move instructions of original caller block up to call instruction.
  MoveInstsBeforeEntryBlock(&preCallSB, new_blk_ptr.get(), call_inst_itr,
                            call_block_itr);

  if (caller_is_loop_header &&
      (*(calleeFn->begin())).GetMergeInst() != nullptr) {
    // We can't place both the caller's merge instruction and
    // another merge instruction in the same block.  So split the
    // calling block. Insert an unconditional branch to a new guard
    // block.  Later, once we know the ID of the last block,  we
    // will move the caller's OpLoopMerge from the last generated
    // block into the first block. We also wait to avoid
    // invalidating various iterators.
    new_blk_ptr = AddGuardBlock(new_blocks, &callee2caller,
                                std::move(new_blk_ptr), entry_blk_label_id);
    if (new_blk_ptr == nullptr) return false;
  }

  // Create return var if needed.
  const uint32_t calleeTypeId = calleeFn->type_id();
  uint32_t returnVarId = 0;
  analysis::Type* calleeType = context()->get_type_mgr()->GetType(calleeTypeId);
  if (calleeType->AsVoid() == nullptr) {
    returnVarId = CreateReturnVar(calleeFn, new_vars);
    if (returnVarId == 0) {
      return false;
    }
  }

  calleeFn->WhileEachInst([&callee2caller, this](const Instruction* cpi) {
    // Create set of callee result ids. Used to detect forward references
    const uint32_t rid = cpi->result_id();
    if (rid != 0 && callee2caller.find(rid) == callee2caller.end()) {
      const uint32_t nid = context()->TakeNextId();
      if (nid == 0) return false;
      callee2caller[rid] = nid;
    }
    return true;
  });

  // Inline DebugClare instructions in the callee's header.
  calleeFn->ForEachDebugInstructionsInHeader(
      [&new_blk_ptr, &callee2caller, &inlined_at_ctx, this](Instruction* inst) {
        InlineSingleInstruction(
            callee2caller, new_blk_ptr.get(), inst,
            context()->get_debug_info_mgr()->BuildDebugInlinedAtChain(
                inst->GetDebugScope().GetInlinedAt(), &inlined_at_ctx));
      });

  // Inline the entry block of the callee function.
  if (!InlineEntryBlock(callee2caller, &new_blk_ptr, calleeFn->begin(),
                        &inlined_at_ctx)) {
    return false;
  }

  // Inline blocks of the callee function other than the entry block.
  new_blk_ptr =
      InlineBasicBlocks(new_blocks, callee2caller, std::move(new_blk_ptr),
                        &inlined_at_ctx, calleeFn);
  if (new_blk_ptr == nullptr) return false;

  new_blk_ptr = InlineReturn(callee2caller, new_blocks, std::move(new_blk_ptr),
                             &inlined_at_ctx, calleeFn,
                             &*(calleeFn->tail()->tail()), returnVarId);

  // Load return value into result id of call, if it exists.
  if (returnVarId != 0) {
    const uint32_t resId = call_inst_itr->result_id();
    assert(resId != 0);
    AddLoad(calleeTypeId, resId, returnVarId, &new_blk_ptr,
            call_inst_itr->dbg_line_inst(), call_inst_itr->GetDebugScope());
  }

  // Move instructions of original caller block after call instruction.
  if (!MoveCallerInstsAfterFunctionCall(&preCallSB, &postCallSB, &new_blk_ptr,
                                        call_inst_itr,
                                        calleeFn->begin() != calleeFn->end()))
    return false;

  // Finalize inline code.
  new_blocks->push_back(std::move(new_blk_ptr));

  if (caller_is_loop_header && (new_blocks->size() > 1)) {
    MoveLoopMergeInstToFirstBlock(new_blocks);

    // If the loop was a single basic block previously, update it's structure.
    auto& header = new_blocks->front();
    auto* merge_inst = header->GetLoopMergeInst();
    if (merge_inst->GetSingleWordInOperand(1u) == header->id()) {
      auto new_id = context()->TakeNextId();
      if (new_id == 0) return false;
      UpdateSingleBlockLoopContinueTarget(new_id, new_blocks);
    }
  }

  // Update block map given replacement blocks.
  for (auto& blk : *new_blocks) {
    id2block_[blk->id()] = &*blk;
  }

  // We need to kill the name and decorations for the call, which will be
  // deleted.
  context()->KillNamesAndDecorates(&*call_inst_itr);

  return true;
}